

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

uint32_t __thiscall
RoboClaw::Read4_1(RoboClaw *this,uint8_t address,uint8_t cmd,uint8_t *status,bool *valid)

{
  ssize_t sVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  uint uVar7;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  char cVar8;
  uint8_t *__nbytes;
  
  if (valid != (bool *)0x0) {
    *valid = false;
  }
  cVar8 = -3;
  __nbytes = status;
  while( true ) {
    (*this->_vptr_RoboClaw[1])(this);
    this->m_crc = 0;
    (**this->_vptr_RoboClaw)(this,(ulong)address);
    crc_update(this,address);
    (**this->_vptr_RoboClaw)(this,(ulong)cmd);
    crc_update(this,cmd);
    sVar1 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var,extraout_DL),(size_t)__nbytes);
    crc_update(this,(uint8_t)sVar1);
    sVar2 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_00,extraout_DL_00),
                 (size_t)__nbytes);
    crc_update(this,(uint8_t)sVar2);
    sVar3 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_01,extraout_DL_01),
                 (size_t)__nbytes);
    crc_update(this,(uint8_t)sVar3);
    sVar4 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_02,extraout_DL_02),
                 (size_t)__nbytes);
    crc_update(this,(uint8_t)sVar4);
    sVar5 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_03,extraout_DL_03),
                 (size_t)__nbytes);
    crc_update(this,(uint8_t)sVar5);
    if (status != (uint8_t *)0x0) {
      *status = (uint8_t)sVar5;
    }
    sVar5 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_04,extraout_DL_04),
                 (size_t)__nbytes);
    sVar6 = read(this,this->m_timeout,(void *)CONCAT71(extraout_var_05,extraout_DL_05),
                 (size_t)__nbytes);
    uVar7 = ((uint)sVar5 & 0xff) << 8 | (uint)sVar6 & 0xff;
    __nbytes = (uint8_t *)(ulong)uVar7;
    if (uVar7 == this->m_crc) break;
    cVar8 = cVar8 + '\x01';
    if (cVar8 == '\0') {
      return 0;
    }
  }
  *valid = true;
  return ((uint)sVar3 & 0xff) << 8 | ((uint)sVar2 & 0xff) << 0x10 | (int)sVar1 << 0x18 |
         (uint)sVar4 & 0xff;
}

Assistant:

uint32_t RoboClaw::Read4_1( uint8_t address, uint8_t cmd, uint8_t *status, bool *valid)
{
    uint8_t crc;

    if(valid)
        *valid = false;

    uint32_t value=0;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( address );
        crc_update( address );
        write(cmd);
        crc_update(cmd);

        data = read( m_timeout );
        crc_update(data);
        value=(uint32_t)data<<24;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<16;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<8;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            if(status)
                *status = data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        *valid = true;
                        return value;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}